

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

bool __thiscall
iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements
          (AttitudeQuaternionEKF *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas,MagnetometerMeasurements *magMeas)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  Vector3 linAccMeasUnitVector;
  Vector3 magMeasUnitVector;
  string local_68;
  Vector3 local_48;
  
  sVar3 = iDynTree::VectorDynSize::size();
  if (sVar3 != this->m_output_size) {
    iDynTree::VectorDynSize::resize((ulong)&this->m_y);
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"linear acceleration","");
  bVar2 = checkValidMeasurement(linAccMeas,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"gyroscope","");
    bVar2 = checkValidMeasurement(gyroMeas,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"magnetometer","");
      bVar2 = checkValidMeasurement(magMeas,&local_68,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        bVar2 = getUnitVector(linAccMeas,(Vector3 *)&local_68);
        if (bVar2) {
          (this->m_Acc_y).m_data[2] = (double)local_68.field_2._M_allocated_capacity;
          (this->m_Acc_y).m_data[0] = (double)local_68._M_dataplus._M_p;
          (this->m_Acc_y).m_data[1] = (double)local_68._M_string_length;
          dVar5 = gyroMeas->m_data[1];
          (this->m_Omega_y).m_data[0] = gyroMeas->m_data[0];
          (this->m_Omega_y).m_data[1] = dVar5;
          (this->m_Omega_y).m_data[2] = gyroMeas->m_data[2];
          bVar2 = getUnitVector(magMeas,&local_48);
          if (bVar2) {
            dVar6 = *(double *)&this->field_0x2f0 * local_48.m_data[2] +
                    *(double *)&this->field_0x2e8 * local_48.m_data[1] +
                    *(double *)&this->m_orientationInSO3 * local_48.m_data[0];
            dVar5 = local_48.m_data[2] * *(double *)&this->field_0x308 +
                    local_48.m_data[1] * *(double *)&this->field_0x300 +
                    local_48.m_data[0] * *(double *)&this->field_0x2f8;
            dVar5 = atan2(-(*(double *)&this->field_0x318 * 0.0 +
                           dVar5 * *(double *)&this->field_0x300 +
                           dVar6 * *(double *)&this->field_0x2e8),
                          *(double *)&this->field_0x310 * 0.0 +
                          dVar5 * *(double *)&this->field_0x2f8 +
                          dVar6 * *(double *)&this->m_orientationInSO3);
            this->m_Mag_y = dVar5;
            bVar2 = callEkfUpdate(this);
            return bVar2;
          }
          pcVar4 = "Cannot retrieve unit vector from magnetometer measuremnts.";
        }
        else {
          pcVar4 = "Cannot retrieve unit vector from linear acceleration measuremnts.";
        }
        iDynTree::reportError("AttitudeQuaternionEKF","updateFilterWithMeasurements",pcVar4);
      }
    }
  }
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas, const iDynTree::MagnetometerMeasurements& magMeas)
{
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }
    if (!checkValidMeasurement(magMeas, "magnetometer", true)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    m_Acc_y = linAccMeasUnitVector;
    m_Omega_y = gyroMeas;

    // compute yaw angle from magnetometer measurements by limiting the vertical influence of magentometer
    // to do this first rotate the measurement to inertial frame, set z-component to zero.
    // convert back to body frame and compute the yaw using atan2(y, x)
    iDynTree::Vector3 mag_meas_in_inertial_frame;
    iDynTree::Vector3 modified_mag_meas_in_body_frame;
    iDynTree::Vector3 magMeasUnitVector;
    if (!getUnitVector(magMeas, magMeasUnitVector))
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "Cannot retrieve unit vector from magnetometer measuremnts.");
        return false;
    }

    using iDynTree::toEigen;
    auto m_A(toEigen(mag_meas_in_inertial_frame));
    auto m_B_modified(toEigen(modified_mag_meas_in_body_frame));
    auto m_yB(toEigen(magMeasUnitVector));
    auto A_R_B(toEigen(m_orientationInSO3));

    m_A = A_R_B * m_yB;
    m_A(2) = 0; // to limit the vertical influence of magnetometer {^A}m_z = 0
    m_B_modified = A_R_B.transpose()* m_A; // rotate vector back to body frame
    m_Mag_y = std::atan2(-m_B_modified(1), m_B_modified(0));

    // set accelerometer and magnetometer measurement
    if (!callEkfUpdate())
    {
        return false;
    }

    return true;
}